

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

void __thiscall Network::run(Network *this,double runtime)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  
  std::operator<<((ostream *)&std::cout,"Running network for ");
  poVar1 = std::ostream::_M_insert<double>(runtime);
  poVar1 = std::operator<<(poVar1," seconds");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = std::chrono::_V2::system_clock::now();
  Clock::setDt(this->clock,this->param->dt);
  while( true ) {
    dVar4 = Clock::getCurrentTime(this->clock);
    if (runtime <= dVar4) break;
    Clock::tick(this->clock,this->param->dt);
    update(this);
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  std::operator<<((ostream *)&std::cout,"Execution time: ");
  poVar1 = std::ostream::_M_insert<double>((double)((lVar3 - lVar2) / 1000) / 1000.0);
  poVar1 = std::operator<<(poVar1," milliseconds");
  std::endl<char,std::char_traits<char>>(poVar1);
  Logging::saveLog(this->logger);
  return;
}

Assistant:

void Network::run(double runtime) {
    cout << "Running network for " << runtime << " seconds" << endl;
    auto start = std::chrono::high_resolution_clock::now(); 
    clock->setDt(param->dt);
    while(clock->getCurrentTime() < runtime) {
        clock->tick(param->dt);
        update();
    }
    auto stop = std::chrono::high_resolution_clock::now();
    auto duration = std::chrono::duration_cast<std::chrono::microseconds>(stop - start); 
    cout << "Execution time: " << duration.count()/1000.0 << " milliseconds" << endl; 
    
    logger->saveLog();
}